

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O3

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  int iVar1;
  long lVar2;
  
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_0015d170;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_0015d1f8;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_0015d240;
  iVar1 = this->nNoises;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->aNoises[lVar2] != (Noise *)0x0) {
        (*(this->aNoises[lVar2]->super_StochasticVariable).super_StochasticProcess.super_Parametric.
          _vptr_Parametric[1])();
        iVar1 = this->nNoises;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->aNoises != (Noise **)0x0) {
    operator_delete__(this->aNoises);
    iVar1 = this->nNoises;
  }
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->aA[lVar2] != (double *)0x0) {
        operator_delete__(this->aA[lVar2]);
        iVar1 = this->nNoises;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->aA != (double **)0x0) {
    operator_delete__(this->aA);
  }
  if (this->aOmega != (double *)0x0) {
    operator_delete__(this->aOmega);
  }
  RandN::~RandN((RandN *)this);
  StochasticProcess::~StochasticProcess(&this->super_StochasticProcess);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}